

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QUtil.cc
# Opt level: O3

string * __thiscall
QUtil::double_to_string_abi_cxx11_
          (string *__return_storage_ptr__,QUtil *this,double num,int decimal_places,
          bool trim_trailing_zeroes)

{
  char cVar1;
  ulong uVar2;
  ostringstream buf;
  locale local_1a0 [8];
  long local_198;
  ulong local_190 [2];
  uint auStack_180 [22];
  ios_base local_128 [264];
  
  uVar2 = 6;
  if (0 < (int)this) {
    uVar2 = (ulong)this & 0xffffffff;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_198);
  std::locale::classic();
  std::ios::imbue(local_1a0);
  std::locale::~locale(local_1a0);
  *(ulong *)((long)local_190 + *(long *)(local_198 + -0x18)) = uVar2;
  *(uint *)((long)auStack_180 + *(long *)(local_198 + -0x18)) =
       *(uint *)((long)auStack_180 + *(long *)(local_198 + -0x18)) & 0xfffffefb | 4;
  std::ostream::_M_insert<double>(num);
  std::__cxx11::stringbuf::str();
  if ((char)decimal_places != '\0') {
    uVar2 = __return_storage_ptr__->_M_string_length;
    while (1 < uVar2) {
      cVar1 = (__return_storage_ptr__->_M_dataplus)._M_p[uVar2 - 1];
      if (cVar1 != '0') {
        if (cVar1 == '.') {
          std::__cxx11::string::pop_back();
        }
        break;
      }
      std::__cxx11::string::pop_back();
      uVar2 = __return_storage_ptr__->_M_string_length;
    }
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_198);
  std::ios_base::~ios_base(local_128);
  return __return_storage_ptr__;
}

Assistant:

std::string
QUtil::double_to_string(double num, int decimal_places, bool trim_trailing_zeroes)
{
    // Backward compatibility -- this code used to use sprintf and treated decimal_places <= 0 to
    // mean to use the default, which was six decimal places. Starting in 10.2, we trim trailing
    // zeroes by default.
    if (decimal_places <= 0) {
        decimal_places = 6;
    }
    std::ostringstream buf;
    buf.imbue(std::locale::classic());
    buf << std::setprecision(decimal_places) << std::fixed << num;
    std::string result = buf.str();
    if (trim_trailing_zeroes) {
        while ((result.length() > 1) && (result.back() == '0')) {
            result.pop_back();
        }
        if ((result.length() > 1) && (result.back() == '.')) {
            result.pop_back();
        }
    }
    return result;
}